

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O0

void GetPredefinedCommands(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *pvVar1;
  value_type pcVar2;
  cmExportCommand *this;
  cmExportLibraryDependenciesCommand *this_00;
  cmFLTKWrapUICommand *this_01;
  cmInstallProgramsCommand *this_02;
  cmLoadCacheCommand *this_03;
  cmOutputRequiredFilesCommand *this_04;
  cmVariableWatchCommand *this_05;
  value_type local_110;
  value_type local_108;
  cmVariableWatchCommand *local_100;
  value_type local_f8;
  value_type local_f0;
  value_type local_e8;
  value_type local_e0;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8;
  value_type local_c0;
  value_type local_b8;
  value_type local_b0;
  value_type local_a8;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  cmOutputRequiredFilesCommand *local_88;
  cmLoadCacheCommand *local_80;
  value_type local_78;
  cmInstallProgramsCommand *local_70;
  value_type local_68;
  cmFLTKWrapUICommand *local_60;
  cmExportLibraryDependenciesCommand *local_58;
  cmExportCommand *local_50;
  value_type local_48;
  value_type local_40;
  value_type local_38;
  value_type local_30 [3];
  value_type local_18;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *local_10;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands_local;
  
  local_10 = commands;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddCompileOptionsCommand::cmAddCompileOptionsCommand((cmAddCompileOptionsCommand *)pcVar2);
  local_18 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(commands,&local_18);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAuxSourceDirectoryCommand::cmAuxSourceDirectoryCommand((cmAuxSourceDirectoryCommand *)pcVar2);
  local_30[0] = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,local_30);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmBuildNameCommand::cmBuildNameCommand((cmBuildNameCommand *)pcVar2);
  local_38 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_38);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmCMakeHostSystemInformationCommand::cmCMakeHostSystemInformationCommand
            ((cmCMakeHostSystemInformationCommand *)pcVar2);
  local_40 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_40);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmElseIfCommand::cmElseIfCommand((cmElseIfCommand *)pcVar2);
  local_48 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_48);
  pvVar1 = local_10;
  this = (cmExportCommand *)operator_new(800);
  cmExportCommand::cmExportCommand(this);
  local_50 = this;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_50);
  pvVar1 = local_10;
  this_00 = (cmExportLibraryDependenciesCommand *)operator_new(0x78);
  cmExportLibraryDependenciesCommand::cmExportLibraryDependenciesCommand(this_00);
  local_58 = this_00;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_58);
  pvVar1 = local_10;
  this_01 = (cmFLTKWrapUICommand *)operator_new(0x88);
  cmFLTKWrapUICommand::cmFLTKWrapUICommand(this_01);
  local_60 = this_01;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_60);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmIncludeExternalMSProjectCommand::cmIncludeExternalMSProjectCommand
            ((cmIncludeExternalMSProjectCommand *)pcVar2);
  local_68 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_68);
  pvVar1 = local_10;
  this_02 = (cmInstallProgramsCommand *)operator_new(0xa0);
  cmInstallProgramsCommand::cmInstallProgramsCommand(this_02);
  local_70 = this_02;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_70);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmLinkLibrariesCommand::cmLinkLibrariesCommand((cmLinkLibrariesCommand *)pcVar2);
  local_78 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_78);
  pvVar1 = local_10;
  this_03 = (cmLoadCacheCommand *)operator_new(0xa0);
  cmLoadCacheCommand::cmLoadCacheCommand(this_03);
  local_80 = this_03;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_80);
  pvVar1 = local_10;
  this_04 = (cmOutputRequiredFilesCommand *)operator_new(0x90);
  cmOutputRequiredFilesCommand::cmOutputRequiredFilesCommand(this_04);
  local_88 = this_04;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_88);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmQTWrapCPPCommand::cmQTWrapCPPCommand((cmQTWrapCPPCommand *)pcVar2);
  local_90 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_90);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmQTWrapUICommand::cmQTWrapUICommand((cmQTWrapUICommand *)pcVar2);
  local_98 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_98);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmRemoveCommand::cmRemoveCommand((cmRemoveCommand *)pcVar2);
  local_a0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_a0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmRemoveDefinitionsCommand::cmRemoveDefinitionsCommand((cmRemoveDefinitionsCommand *)pcVar2);
  local_a8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_a8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSourceGroupCommand::cmSourceGroupCommand((cmSourceGroupCommand *)pcVar2);
  local_b0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_b0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSubdirDependsCommand::cmSubdirDependsCommand((cmSubdirDependsCommand *)pcVar2);
  local_b8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_b8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x78);
  cmTargetCompileDefinitionsCommand::cmTargetCompileDefinitionsCommand
            ((cmTargetCompileDefinitionsCommand *)pcVar2);
  local_c0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_c0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x78);
  cmTargetCompileFeaturesCommand::cmTargetCompileFeaturesCommand
            ((cmTargetCompileFeaturesCommand *)pcVar2);
  local_c8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_c8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x78);
  cmTargetCompileOptionsCommand::cmTargetCompileOptionsCommand
            ((cmTargetCompileOptionsCommand *)pcVar2);
  local_d0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_d0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x78);
  cmTargetIncludeDirectoriesCommand::cmTargetIncludeDirectoriesCommand
            ((cmTargetIncludeDirectoriesCommand *)pcVar2);
  local_d8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_d8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x78);
  cmTargetSourcesCommand::cmTargetSourcesCommand((cmTargetSourcesCommand *)pcVar2);
  local_e0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_e0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmUseMangledMesaCommand::cmUseMangledMesaCommand((cmUseMangledMesaCommand *)pcVar2);
  local_e8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_e8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmUtilitySourceCommand::cmUtilitySourceCommand((cmUtilitySourceCommand *)pcVar2);
  local_f0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_f0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmVariableRequiresCommand::cmVariableRequiresCommand((cmVariableRequiresCommand *)pcVar2);
  local_f8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_f8);
  pvVar1 = local_10;
  this_05 = (cmVariableWatchCommand *)operator_new(0x80);
  cmVariableWatchCommand::cmVariableWatchCommand(this_05);
  local_100 = this_05;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_100)
  ;
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmWriteFileCommand::cmWriteFileCommand((cmWriteFileCommand *)pcVar2);
  local_108 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_108);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmLoadCommandCommand::cmLoadCommandCommand((cmLoadCommandCommand *)pcVar2);
  local_110 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_110);
  return;
}

Assistant:

void GetPredefinedCommands(std::vector<cmCommand*>& commands)
{
commands.push_back(new cmAddCompileOptionsCommand);
commands.push_back(new cmAuxSourceDirectoryCommand);
commands.push_back(new cmBuildNameCommand);
commands.push_back(new cmCMakeHostSystemInformationCommand);
commands.push_back(new cmElseIfCommand);
commands.push_back(new cmExportCommand);
commands.push_back(new cmExportLibraryDependenciesCommand);
commands.push_back(new cmFLTKWrapUICommand);
commands.push_back(new cmIncludeExternalMSProjectCommand);
commands.push_back(new cmInstallProgramsCommand);
commands.push_back(new cmLinkLibrariesCommand);
commands.push_back(new cmLoadCacheCommand);
commands.push_back(new cmOutputRequiredFilesCommand);
commands.push_back(new cmQTWrapCPPCommand);
commands.push_back(new cmQTWrapUICommand);
commands.push_back(new cmRemoveCommand);
commands.push_back(new cmRemoveDefinitionsCommand);
commands.push_back(new cmSourceGroupCommand);
commands.push_back(new cmSubdirDependsCommand);
commands.push_back(new cmTargetCompileDefinitionsCommand);
commands.push_back(new cmTargetCompileFeaturesCommand);
commands.push_back(new cmTargetCompileOptionsCommand);
commands.push_back(new cmTargetIncludeDirectoriesCommand);
commands.push_back(new cmTargetSourcesCommand);
commands.push_back(new cmUseMangledMesaCommand);
commands.push_back(new cmUtilitySourceCommand);
commands.push_back(new cmVariableRequiresCommand);
commands.push_back(new cmVariableWatchCommand);
commands.push_back(new cmWriteFileCommand);
commands.push_back(new cmLoadCommandCommand);

}